

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

const_iterator __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::cbegin(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *this)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  Node *pNVar4;
  ulong *puVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  
  if (this->mNumElements != 0) {
    pNVar4 = this->mKeyVals;
    puVar5 = (ulong *)this->mInfo;
    uVar3 = *puVar5;
    while (uVar3 == 0) {
      pNVar4 = pNVar4 + 8;
      puVar1 = puVar5 + 1;
      puVar5 = puVar5 + 1;
      uVar3 = *puVar1;
    }
    uVar2 = 0;
    if (uVar3 != 0) {
      for (; (uVar3 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
      }
    }
    uVar3 = uVar2 >> 3 & 0x1fffffff;
    cVar6.mInfo = (uint8_t *)((long)puVar5 + uVar3);
    cVar6.mKeyVals = pNVar4 + uVar3;
    return cVar6;
  }
  cVar7.mInfo = (uint8_t *)0x0;
  cVar7.mKeyVals = (NodePtr)this->mInfo;
  return cVar7;
}

Assistant:

bool empty() const noexcept {
        ROBIN_HOOD_TRACE(this)
        return 0 == mNumElements;
    }